

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_as_json_decimal128(void)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  undefined8 extraout_RAX;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined **ppuVar11;
  char *unaff_R15;
  size_t len;
  bson_decimal128_t decimal128;
  undefined4 uStack_adc;
  undefined8 uStack_ad8;
  undefined2 uStack_ad0;
  int iStack_ac8;
  int iStack_ac4;
  char acStack_ac0 [504];
  code *pcStack_8c8;
  undefined1 auStack_8b8 [512];
  char *pcStack_6b8;
  code *pcStack_6b0;
  int iStack_6a0;
  int iStack_69c;
  char acStack_698 [504];
  long *plStack_4a0;
  long lStack_410;
  long lStack_408;
  undefined1 auStack_400 [128];
  undefined1 auStack_380 [232];
  undefined1 auStack_298 [608];
  long *plStack_38;
  undefined1 auStack_28 [8];
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0x3040000000000000;
  local_20 = 0xb;
  plVar3 = (long *)bson_new();
  cVar1 = bson_append_decimal128(plVar3,"decimal128",0xffffffff,&local_20);
  if (cVar1 == '\0') {
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcVar4 = (char *)bson_as_json(plVar3,auStack_28);
    if (pcVar4 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      bson_free(pcVar4);
      bson_destroy(plVar3);
      return;
    }
    iVar2 = strcmp(pcVar4,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  test_bson_as_json_decimal128_cold_2();
  plStack_38 = plVar3;
  cVar1 = bson_init_from_json(auStack_380,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_298);
  if (cVar1 == '\0') goto LAB_00133315;
  cVar1 = bson_iter_init(auStack_400,auStack_380);
  if (cVar1 == '\0') {
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    test_bson_json_number_decimal_cold_5();
  }
  else {
    cVar1 = bson_iter_find(auStack_400,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar3 = &lStack_410;
    bson_iter_decimal128(auStack_400,plVar3);
    if (lStack_410 != 0xb) goto LAB_0013330b;
    if (lStack_408 == 0x3040000000000000) {
      bson_destroy(auStack_380);
      return;
    }
  }
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  test_bson_json_number_decimal_cold_1();
  pcVar4 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar11 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_4a0 = plVar3;
  do {
    pcStack_6b0 = (code *)0x133357;
    lVar5 = bson_new_from_json(pcVar4,0xffffffffffffffff,&iStack_6a0);
    if (lVar5 != 0) {
      pcStack_6b0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_6b0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_698,
              unaff_R15);
      pcStack_6b0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_6a0 != 1) {
LAB_001333cc:
      pcStack_6b0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_8c8 = (code *)0x1333f1;
      pcStack_6b8 = acStack_698;
      pcStack_6b0 = (code *)&iStack_6a0;
      pcVar4 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                          auStack_8b8);
      pcStack_8c8 = (code *)0x1333fe;
      pcVar6 = (char *)bson_as_json(pcVar4,0);
      if (pcVar6 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_8c8 = (code *)0x133428;
        bson_free(pcVar6);
        pcStack_8c8 = (code *)0x133430;
        bson_destroy(pcVar4);
        return;
      }
      pcStack_8c8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar6,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_8c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_ad8 = 0x2200223a2261227b;
      uStack_ad0 = 0x7d;
      uStack_adc = 0x227b;
      pcStack_8c8 = (code *)pcVar4;
      lVar5 = bson_new_from_json(&uStack_ad8,9,&iStack_ac8);
      if (lVar5 == 0) {
        if (iStack_ac8 != 1) goto LAB_001334fc;
        if (iStack_ac4 != 1) goto LAB_00133501;
        pcVar4 = acStack_ac0;
        pcVar6 = strstr(pcVar4,"Got parse error");
        if (pcVar6 == (char *)0x0) goto LAB_00133506;
        lVar5 = bson_new_from_json(&uStack_adc,3,&iStack_ac8);
        if (lVar5 != 0) goto LAB_001334f7;
        if (iStack_ac8 != 1) goto LAB_0013350e;
        if (iStack_ac4 == 1) {
          pcVar6 = strstr(pcVar4,"Got parse error");
          if (pcVar6 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar8 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar7 = bson_bcon_magic();
      uVar8 = bcon_new(0,"a",uVar7,0xf,1,0,uVar8,pcVar4,ppuVar11);
      uVar9 = bcon_new(0,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar8,uVar9,0);
      uVar8 = bson_new();
      uVar9 = bson_new();
      uVar10 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar8,uVar9,uVar10,0);
      uVar8 = bcon_new(0,"a",uVar7,0xf,1,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar8,0);
      uVar8 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar8,0);
      uVar8 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar8,0);
      uVar8 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar8,0);
      uVar8 = bson_new();
      _test_json_produces_multiple("[]",0,uVar8,0);
      uVar8 = bcon_new(0,"0","{","x",uVar7,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar8,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_69c != 2) {
      pcStack_6b0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    unaff_R15 = ppuVar11[-1];
    pcStack_6b0 = (code *)0x13337e;
    pcVar4 = strstr(acStack_698,unaff_R15);
    if (pcVar4 == (char *)0x0) goto LAB_001333a4;
    pcVar4 = *ppuVar11;
    ppuVar11 = ppuVar11 + 2;
    if (pcVar4 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

static void
test_bson_as_json_decimal128 (void)
{
   size_t len;
   bson_t *b;
   char *str;
   bson_decimal128_t decimal128;
   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;

   b = bson_new ();
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));
   str = bson_as_json (b, &len);
   ASSERT_CMPSTR (str,
                  "{ "
                  "\"decimal128\" : { \"$numberDecimal\" : \"11\" }"
                  " }");

   bson_free (str);
   bson_destroy (b);
}